

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_heap.hpp
# Opt level: O2

void unodb::test::allocation_failure_injector::maybe_fail(void)

{
  __atomic_base<unsigned_long> _Var1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  if ((*(char *)(in_FS_OFFSET + -8) == '\0') &&
     (fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i != 0)) {
    LOCK();
    _Var1 = allocation_counter.super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    bVar3 = (fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i - 1U)._M_i <=
            (ulong)allocation_counter.super___atomic_base<unsigned_long>._M_i;
    allocation_counter.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
    if (bVar3) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = dup2;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

static void maybe_fail() {
    // Inspects the fail counter.  If non-zero, then bumps the allocation
    // counter.  If that results in the allocation counter reaching or exceeding
    // the fail counter, then throw std::bad_alloc.
    if (UNODB_DETAIL_UNLIKELY(paused)) return;
    const auto fail_counter =
        fail_on_nth_allocation_.load(std::memory_order_acquire);
    if (UNODB_DETAIL_UNLIKELY(fail_counter != 0) &&
        (allocation_counter.fetch_add(1, std::memory_order_relaxed) >=
         fail_counter - 1)) {
      throw std::bad_alloc{};
    }
  }